

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommands.cxx
# Opt level: O3

void GetProjectCommands(cmState *state)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmCommand *pcVar2;
  cmExportCommand *this;
  string local_38;
  
  paVar1 = &local_38.field_2;
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"add_custom_command","");
  pcVar2 = (cmCommand *)operator_new(0x30);
  pcVar2->Makefile = (cmMakefile *)0x0;
  (pcVar2->Error)._M_dataplus._M_p = (pointer)&(pcVar2->Error).field_2;
  (pcVar2->Error)._M_string_length = 0;
  (pcVar2->Error).field_2._M_local_buf[0] = '\0';
  pcVar2->_vptr_cmCommand = (_func_int **)&PTR__cmCommand_005e5c08;
  cmState::AddBuiltinCommand(state,&local_38,pcVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"add_custom_target","");
  pcVar2 = (cmCommand *)operator_new(0x30);
  pcVar2->Makefile = (cmMakefile *)0x0;
  (pcVar2->Error)._M_dataplus._M_p = (pointer)&(pcVar2->Error).field_2;
  (pcVar2->Error)._M_string_length = 0;
  (pcVar2->Error).field_2._M_local_buf[0] = '\0';
  pcVar2->_vptr_cmCommand = (_func_int **)&PTR__cmCommand_005e5c68;
  cmState::AddBuiltinCommand(state,&local_38,pcVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"add_definitions","");
  pcVar2 = (cmCommand *)operator_new(0x30);
  pcVar2->Makefile = (cmMakefile *)0x0;
  (pcVar2->Error)._M_dataplus._M_p = (pointer)&(pcVar2->Error).field_2;
  (pcVar2->Error)._M_string_length = 0;
  (pcVar2->Error).field_2._M_local_buf[0] = '\0';
  pcVar2->_vptr_cmCommand = (_func_int **)&PTR__cmCommand_005e5cc8;
  cmState::AddBuiltinCommand(state,&local_38,pcVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"add_dependencies","");
  pcVar2 = (cmCommand *)operator_new(0x30);
  pcVar2->Makefile = (cmMakefile *)0x0;
  (pcVar2->Error)._M_dataplus._M_p = (pointer)&(pcVar2->Error).field_2;
  (pcVar2->Error)._M_string_length = 0;
  (pcVar2->Error).field_2._M_local_buf[0] = '\0';
  pcVar2->_vptr_cmCommand = (_func_int **)&PTR__cmCommand_005e5d28;
  cmState::AddBuiltinCommand(state,&local_38,pcVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"add_executable","");
  pcVar2 = (cmCommand *)operator_new(0x30);
  pcVar2->Makefile = (cmMakefile *)0x0;
  (pcVar2->Error)._M_dataplus._M_p = (pointer)&(pcVar2->Error).field_2;
  (pcVar2->Error)._M_string_length = 0;
  (pcVar2->Error).field_2._M_local_buf[0] = '\0';
  pcVar2->_vptr_cmCommand = (_func_int **)&PTR__cmCommand_005e5d88;
  cmState::AddBuiltinCommand(state,&local_38,pcVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"add_library","");
  pcVar2 = (cmCommand *)operator_new(0x30);
  pcVar2->Makefile = (cmMakefile *)0x0;
  (pcVar2->Error)._M_dataplus._M_p = (pointer)&(pcVar2->Error).field_2;
  (pcVar2->Error)._M_string_length = 0;
  (pcVar2->Error).field_2._M_local_buf[0] = '\0';
  pcVar2->_vptr_cmCommand = (_func_int **)&PTR__cmCommand_005e5de8;
  cmState::AddBuiltinCommand(state,&local_38,pcVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"add_subdirectory","");
  pcVar2 = (cmCommand *)operator_new(0x30);
  pcVar2->Makefile = (cmMakefile *)0x0;
  (pcVar2->Error)._M_dataplus._M_p = (pointer)&(pcVar2->Error).field_2;
  (pcVar2->Error)._M_string_length = 0;
  (pcVar2->Error).field_2._M_local_buf[0] = '\0';
  pcVar2->_vptr_cmCommand = (_func_int **)&PTR__cmCommand_005e5e48;
  cmState::AddBuiltinCommand(state,&local_38,pcVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"add_test","");
  pcVar2 = (cmCommand *)operator_new(0x30);
  pcVar2->Makefile = (cmMakefile *)0x0;
  (pcVar2->Error)._M_dataplus._M_p = (pointer)&(pcVar2->Error).field_2;
  (pcVar2->Error)._M_string_length = 0;
  (pcVar2->Error).field_2._M_local_buf[0] = '\0';
  pcVar2->_vptr_cmCommand = (_func_int **)&PTR__cmCommand_005e5ea8;
  cmState::AddBuiltinCommand(state,&local_38,pcVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"build_command","");
  pcVar2 = (cmCommand *)operator_new(0x30);
  pcVar2->Makefile = (cmMakefile *)0x0;
  (pcVar2->Error)._M_dataplus._M_p = (pointer)&(pcVar2->Error).field_2;
  (pcVar2->Error)._M_string_length = 0;
  (pcVar2->Error).field_2._M_local_buf[0] = '\0';
  pcVar2->_vptr_cmCommand = (_func_int **)&PTR__cmCommand_005e5fc8;
  cmState::AddBuiltinCommand(state,&local_38,pcVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"create_test_sourcelist","");
  pcVar2 = (cmCommand *)operator_new(0x30);
  pcVar2->Makefile = (cmMakefile *)0x0;
  (pcVar2->Error)._M_dataplus._M_p = (pointer)&(pcVar2->Error).field_2;
  (pcVar2->Error)._M_string_length = 0;
  (pcVar2->Error).field_2._M_local_buf[0] = '\0';
  pcVar2->_vptr_cmCommand = (_func_int **)&PTR__cmCommand_005e6278;
  cmState::AddBuiltinCommand(state,&local_38,pcVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"define_property","");
  pcVar2 = (cmCommand *)operator_new(0x90);
  pcVar2->Makefile = (cmMakefile *)0x0;
  (pcVar2->Error)._M_dataplus._M_p = (pointer)&(pcVar2->Error).field_2;
  (pcVar2->Error)._M_string_length = 0;
  (pcVar2->Error).field_2._M_local_buf[0] = '\0';
  pcVar2->_vptr_cmCommand = (_func_int **)&PTR__cmDefinePropertyCommand_005e62d8;
  pcVar2[1]._vptr_cmCommand = (_func_int **)&pcVar2[1].Error;
  pcVar2[1].Makefile = (cmMakefile *)0x0;
  *(undefined1 *)&pcVar2[1].Error._M_dataplus._M_p = 0;
  pcVar2[1].Error.field_2._M_allocated_capacity = (size_type)(pcVar2 + 2);
  *(undefined8 *)((long)&pcVar2[1].Error.field_2 + 8) = 0;
  *(undefined1 *)&pcVar2[2]._vptr_cmCommand = 0;
  pcVar2[2].Error._M_dataplus._M_p = (pointer)&pcVar2[2].Error.field_2;
  pcVar2[2].Error._M_string_length = 0;
  pcVar2[2].Error.field_2._M_local_buf[0] = '\0';
  cmState::AddBuiltinCommand(state,&local_38,pcVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"enable_language","");
  pcVar2 = (cmCommand *)operator_new(0x30);
  pcVar2->Makefile = (cmMakefile *)0x0;
  (pcVar2->Error)._M_dataplus._M_p = (pointer)&(pcVar2->Error).field_2;
  (pcVar2->Error)._M_string_length = 0;
  (pcVar2->Error).field_2._M_local_buf[0] = '\0';
  pcVar2->_vptr_cmCommand = (_func_int **)&PTR__cmCommand_005e6398;
  cmState::AddBuiltinCommand(state,&local_38,pcVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"enable_testing","");
  pcVar2 = (cmCommand *)operator_new(0x30);
  pcVar2->Makefile = (cmMakefile *)0x0;
  (pcVar2->Error)._M_dataplus._M_p = (pointer)&(pcVar2->Error).field_2;
  (pcVar2->Error)._M_string_length = 0;
  (pcVar2->Error).field_2._M_local_buf[0] = '\0';
  pcVar2->_vptr_cmCommand = (_func_int **)&PTR__cmCommand_005e63f8;
  cmState::AddBuiltinCommand(state,&local_38,pcVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"get_source_file_property","")
  ;
  pcVar2 = (cmCommand *)operator_new(0x30);
  pcVar2->Makefile = (cmMakefile *)0x0;
  (pcVar2->Error)._M_dataplus._M_p = (pointer)&(pcVar2->Error).field_2;
  (pcVar2->Error)._M_string_length = 0;
  (pcVar2->Error).field_2._M_local_buf[0] = '\0';
  pcVar2->_vptr_cmCommand = (_func_int **)&PTR__cmCommand_005e6c70;
  cmState::AddBuiltinCommand(state,&local_38,pcVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"get_target_property","");
  pcVar2 = (cmCommand *)operator_new(0x30);
  pcVar2->Makefile = (cmMakefile *)0x0;
  (pcVar2->Error)._M_dataplus._M_p = (pointer)&(pcVar2->Error).field_2;
  (pcVar2->Error)._M_string_length = 0;
  (pcVar2->Error).field_2._M_local_buf[0] = '\0';
  pcVar2->_vptr_cmCommand = (_func_int **)&PTR__cmCommand_005e6cd0;
  cmState::AddBuiltinCommand(state,&local_38,pcVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"get_test_property","");
  pcVar2 = (cmCommand *)operator_new(0x30);
  pcVar2->Makefile = (cmMakefile *)0x0;
  (pcVar2->Error)._M_dataplus._M_p = (pointer)&(pcVar2->Error).field_2;
  (pcVar2->Error)._M_string_length = 0;
  (pcVar2->Error).field_2._M_local_buf[0] = '\0';
  pcVar2->_vptr_cmCommand = (_func_int **)&PTR__cmCommand_005e6d30;
  cmState::AddBuiltinCommand(state,&local_38,pcVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"include_directories","");
  pcVar2 = (cmCommand *)operator_new(0x30);
  pcVar2->Makefile = (cmMakefile *)0x0;
  (pcVar2->Error)._M_dataplus._M_p = (pointer)&(pcVar2->Error).field_2;
  (pcVar2->Error)._M_string_length = 0;
  (pcVar2->Error).field_2._M_local_buf[0] = '\0';
  pcVar2->_vptr_cmCommand = (_func_int **)&PTR__cmCommand_005e6e98;
  cmState::AddBuiltinCommand(state,&local_38,pcVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"include_regular_expression","");
  pcVar2 = (cmCommand *)operator_new(0x30);
  pcVar2->Makefile = (cmMakefile *)0x0;
  (pcVar2->Error)._M_dataplus._M_p = (pointer)&(pcVar2->Error).field_2;
  (pcVar2->Error)._M_string_length = 0;
  (pcVar2->Error).field_2._M_local_buf[0] = '\0';
  pcVar2->_vptr_cmCommand = (_func_int **)&PTR__cmCommand_005e6fb8;
  cmState::AddBuiltinCommand(state,&local_38,pcVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"install","");
  pcVar2 = (cmCommand *)operator_new(0x50);
  pcVar2->Makefile = (cmMakefile *)0x0;
  (pcVar2->Error)._M_dataplus._M_p = (pointer)&(pcVar2->Error).field_2;
  (pcVar2->Error)._M_string_length = 0;
  (pcVar2->Error).field_2._M_local_buf[0] = '\0';
  pcVar2->_vptr_cmCommand = (_func_int **)&PTR__cmInstallCommand_005e7018;
  pcVar2[1]._vptr_cmCommand = (_func_int **)&pcVar2[1].Error;
  pcVar2[1].Makefile = (cmMakefile *)0x0;
  *(undefined1 *)&pcVar2[1].Error._M_dataplus._M_p = 0;
  cmState::AddBuiltinCommand(state,&local_38,pcVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"install_files","");
  pcVar2 = (cmCommand *)operator_new(0x88);
  pcVar2->Makefile = (cmMakefile *)0x0;
  (pcVar2->Error)._M_dataplus._M_p = (pointer)&(pcVar2->Error).field_2;
  (pcVar2->Error)._M_string_length = 0;
  (pcVar2->Error).field_2._M_local_buf[0] = '\0';
  pcVar2->_vptr_cmCommand = (_func_int **)&PTR__cmInstallFilesCommand_005e7078;
  pcVar2[1]._vptr_cmCommand = (_func_int **)0x0;
  pcVar2[1].Makefile = (cmMakefile *)0x0;
  *(undefined8 *)((long)&pcVar2[1].Makefile + 1) = 0;
  *(undefined8 *)((long)&pcVar2[1].Error._M_dataplus._M_p + 1) = 0;
  pcVar2[1].Error.field_2._M_allocated_capacity = (size_type)(pcVar2 + 2);
  *(undefined8 *)((long)&pcVar2[1].Error.field_2 + 8) = 0;
  *(undefined1 *)&pcVar2[2]._vptr_cmCommand = 0;
  pcVar2[2].Error._M_dataplus._M_p = (pointer)0x0;
  pcVar2[2].Error._M_string_length = 0;
  pcVar2[2].Error.field_2._M_allocated_capacity = 0;
  cmState::AddBuiltinCommand(state,&local_38,pcVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"install_targets","");
  pcVar2 = (cmCommand *)operator_new(0x30);
  pcVar2->Makefile = (cmMakefile *)0x0;
  (pcVar2->Error)._M_dataplus._M_p = (pointer)&(pcVar2->Error).field_2;
  (pcVar2->Error)._M_string_length = 0;
  (pcVar2->Error).field_2._M_local_buf[0] = '\0';
  pcVar2->_vptr_cmCommand = (_func_int **)&PTR__cmCommand_005e7138;
  cmState::AddBuiltinCommand(state,&local_38,pcVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"link_directories","");
  pcVar2 = (cmCommand *)operator_new(0x30);
  pcVar2->Makefile = (cmMakefile *)0x0;
  (pcVar2->Error)._M_dataplus._M_p = (pointer)&(pcVar2->Error).field_2;
  (pcVar2->Error)._M_string_length = 0;
  (pcVar2->Error).field_2._M_local_buf[0] = '\0';
  pcVar2->_vptr_cmCommand = (_func_int **)&PTR__cmCommand_005e7198;
  cmState::AddBuiltinCommand(state,&local_38,pcVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"project","");
  pcVar2 = (cmCommand *)operator_new(0x30);
  pcVar2->Makefile = (cmMakefile *)0x0;
  (pcVar2->Error)._M_dataplus._M_p = (pointer)&(pcVar2->Error).field_2;
  (pcVar2->Error)._M_string_length = 0;
  (pcVar2->Error).field_2._M_local_buf[0] = '\0';
  pcVar2->_vptr_cmCommand = (_func_int **)&PTR__cmCommand_005e7a68;
  cmState::AddBuiltinCommand(state,&local_38,pcVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"set_source_files_properties","");
  pcVar2 = (cmCommand *)operator_new(0x30);
  pcVar2->Makefile = (cmMakefile *)0x0;
  (pcVar2->Error)._M_dataplus._M_p = (pointer)&(pcVar2->Error).field_2;
  (pcVar2->Error)._M_string_length = 0;
  (pcVar2->Error).field_2._M_local_buf[0] = '\0';
  pcVar2->_vptr_cmCommand = (_func_int **)&PTR__cmCommand_005e7e58;
  cmState::AddBuiltinCommand(state,&local_38,pcVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"set_target_properties","");
  pcVar2 = (cmCommand *)operator_new(0x30);
  pcVar2->Makefile = (cmMakefile *)0x0;
  (pcVar2->Error)._M_dataplus._M_p = (pointer)&(pcVar2->Error).field_2;
  (pcVar2->Error)._M_string_length = 0;
  (pcVar2->Error).field_2._M_local_buf[0] = '\0';
  pcVar2->_vptr_cmCommand = (_func_int **)&PTR__cmCommand_005e7eb8;
  cmState::AddBuiltinCommand(state,&local_38,pcVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"set_tests_properties","");
  pcVar2 = (cmCommand *)operator_new(0x30);
  pcVar2->Makefile = (cmMakefile *)0x0;
  (pcVar2->Error)._M_dataplus._M_p = (pointer)&(pcVar2->Error).field_2;
  (pcVar2->Error)._M_string_length = 0;
  (pcVar2->Error).field_2._M_local_buf[0] = '\0';
  pcVar2->_vptr_cmCommand = (_func_int **)&PTR__cmCommand_005e7f18;
  cmState::AddBuiltinCommand(state,&local_38,pcVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"subdirs","");
  pcVar2 = (cmCommand *)operator_new(0x30);
  pcVar2->Makefile = (cmMakefile *)0x0;
  (pcVar2->Error)._M_dataplus._M_p = (pointer)&(pcVar2->Error).field_2;
  (pcVar2->Error)._M_string_length = 0;
  (pcVar2->Error).field_2._M_local_buf[0] = '\0';
  pcVar2->_vptr_cmCommand = (_func_int **)&PTR__cmCommand_005e8098;
  cmState::AddBuiltinCommand(state,&local_38,pcVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"target_compile_definitions","");
  pcVar2 = (cmCommand *)operator_new(0x58);
  pcVar2->Makefile = (cmMakefile *)0x0;
  (pcVar2->Error)._M_dataplus._M_p = (pointer)&(pcVar2->Error).field_2;
  (pcVar2->Error)._M_string_length = 0;
  (pcVar2->Error).field_2._M_local_buf[0] = '\0';
  pcVar2[1]._vptr_cmCommand = (_func_int **)&pcVar2[1].Error;
  pcVar2[1].Makefile = (cmMakefile *)0x0;
  *(undefined1 *)&pcVar2[1].Error._M_dataplus._M_p = 0;
  pcVar2[1].Error.field_2._M_allocated_capacity = 0;
  pcVar2->_vptr_cmCommand = (_func_int **)&PTR__cmTargetPropCommandBase_005e8158;
  cmState::AddBuiltinCommand(state,&local_38,pcVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"target_compile_features","");
  pcVar2 = (cmCommand *)operator_new(0x58);
  pcVar2->Makefile = (cmMakefile *)0x0;
  (pcVar2->Error)._M_dataplus._M_p = (pointer)&(pcVar2->Error).field_2;
  (pcVar2->Error)._M_string_length = 0;
  (pcVar2->Error).field_2._M_local_buf[0] = '\0';
  pcVar2[1]._vptr_cmCommand = (_func_int **)&pcVar2[1].Error;
  pcVar2[1].Makefile = (cmMakefile *)0x0;
  *(undefined1 *)&pcVar2[1].Error._M_dataplus._M_p = 0;
  pcVar2[1].Error.field_2._M_allocated_capacity = 0;
  pcVar2->_vptr_cmCommand = (_func_int **)&PTR__cmTargetPropCommandBase_005e81d8;
  cmState::AddBuiltinCommand(state,&local_38,pcVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"target_compile_options","");
  pcVar2 = (cmCommand *)operator_new(0x58);
  pcVar2->Makefile = (cmMakefile *)0x0;
  (pcVar2->Error)._M_dataplus._M_p = (pointer)&(pcVar2->Error).field_2;
  (pcVar2->Error)._M_string_length = 0;
  (pcVar2->Error).field_2._M_local_buf[0] = '\0';
  pcVar2[1]._vptr_cmCommand = (_func_int **)&pcVar2[1].Error;
  pcVar2[1].Makefile = (cmMakefile *)0x0;
  *(undefined1 *)&pcVar2[1].Error._M_dataplus._M_p = 0;
  pcVar2[1].Error.field_2._M_allocated_capacity = 0;
  pcVar2->_vptr_cmCommand = (_func_int **)&PTR__cmTargetPropCommandBase_005e8258;
  cmState::AddBuiltinCommand(state,&local_38,pcVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"target_include_directories","");
  pcVar2 = (cmCommand *)operator_new(0x58);
  pcVar2->Makefile = (cmMakefile *)0x0;
  (pcVar2->Error)._M_dataplus._M_p = (pointer)&(pcVar2->Error).field_2;
  (pcVar2->Error)._M_string_length = 0;
  (pcVar2->Error).field_2._M_local_buf[0] = '\0';
  pcVar2[1]._vptr_cmCommand = (_func_int **)&pcVar2[1].Error;
  pcVar2[1].Makefile = (cmMakefile *)0x0;
  *(undefined1 *)&pcVar2[1].Error._M_dataplus._M_p = 0;
  pcVar2[1].Error.field_2._M_allocated_capacity = 0;
  pcVar2->_vptr_cmCommand = (_func_int **)&PTR__cmTargetPropCommandBase_005e82d8;
  cmState::AddBuiltinCommand(state,&local_38,pcVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"target_link_libraries","");
  pcVar2 = (cmCommand *)operator_new(0x40);
  pcVar2->Makefile = (cmMakefile *)0x0;
  (pcVar2->Error)._M_dataplus._M_p = (pointer)&(pcVar2->Error).field_2;
  (pcVar2->Error)._M_string_length = 0;
  (pcVar2->Error).field_2._M_local_buf[0] = '\0';
  pcVar2->_vptr_cmCommand = (_func_int **)&PTR__cmCommand_005e8458;
  pcVar2[1]._vptr_cmCommand = (_func_int **)0x0;
  *(undefined4 *)&pcVar2[1].Makefile = 0;
  cmState::AddBuiltinCommand(state,&local_38,pcVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"target_sources","");
  pcVar2 = (cmCommand *)operator_new(0x58);
  pcVar2->Makefile = (cmMakefile *)0x0;
  (pcVar2->Error)._M_dataplus._M_p = (pointer)&(pcVar2->Error).field_2;
  (pcVar2->Error)._M_string_length = 0;
  (pcVar2->Error).field_2._M_local_buf[0] = '\0';
  pcVar2[1]._vptr_cmCommand = (_func_int **)&pcVar2[1].Error;
  pcVar2[1].Makefile = (cmMakefile *)0x0;
  *(undefined1 *)&pcVar2[1].Error._M_dataplus._M_p = 0;
  pcVar2[1].Error.field_2._M_allocated_capacity = 0;
  pcVar2->_vptr_cmCommand = (_func_int **)&PTR__cmTargetPropCommandBase_005e8538;
  cmState::AddBuiltinCommand(state,&local_38,pcVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"try_compile","");
  pcVar2 = (cmCommand *)operator_new(0xb0);
  pcVar2->Makefile = (cmMakefile *)0x0;
  (pcVar2->Error)._M_dataplus._M_p = (pointer)&(pcVar2->Error).field_2;
  (pcVar2->Error)._M_string_length = 0;
  (pcVar2->Error).field_2._M_local_buf[0] = '\0';
  pcVar2[1]._vptr_cmCommand = (_func_int **)&pcVar2[1].Error;
  pcVar2[1].Makefile = (cmMakefile *)0x0;
  *(undefined1 *)&pcVar2[1].Error._M_dataplus._M_p = 0;
  pcVar2[1].Error.field_2._M_allocated_capacity = (size_type)(pcVar2 + 2);
  *(undefined8 *)((long)&pcVar2[1].Error.field_2 + 8) = 0;
  *(undefined1 *)&pcVar2[2]._vptr_cmCommand = 0;
  pcVar2[2].Error._M_dataplus._M_p = (pointer)&pcVar2[2].Error.field_2;
  pcVar2[2].Error._M_string_length = 0;
  pcVar2[2].Error.field_2._M_local_buf[0] = '\0';
  *(undefined1 *)&pcVar2[3]._vptr_cmCommand = 0;
  pcVar2[3].Makefile = (cmMakefile *)0x0;
  pcVar2[3].Error._M_dataplus._M_p = (pointer)0x0;
  pcVar2[3].Error._M_string_length = 0;
  pcVar2->_vptr_cmCommand = (_func_int **)&PTR__cmCoreTryCompile_005e85b8;
  cmState::AddBuiltinCommand(state,&local_38,pcVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"try_run","");
  pcVar2 = (cmCommand *)operator_new(0x150);
  pcVar2->Makefile = (cmMakefile *)0x0;
  (pcVar2->Error)._M_dataplus._M_p = (pointer)&(pcVar2->Error).field_2;
  (pcVar2->Error)._M_string_length = 0;
  (pcVar2->Error).field_2._M_local_buf[0] = '\0';
  pcVar2[1]._vptr_cmCommand = (_func_int **)&pcVar2[1].Error;
  pcVar2[1].Makefile = (cmMakefile *)0x0;
  *(undefined1 *)&pcVar2[1].Error._M_dataplus._M_p = 0;
  pcVar2[1].Error.field_2._M_allocated_capacity = (size_type)(pcVar2 + 2);
  *(undefined8 *)((long)&pcVar2[1].Error.field_2 + 8) = 0;
  *(undefined1 *)&pcVar2[2]._vptr_cmCommand = 0;
  pcVar2[2].Error._M_dataplus._M_p = (pointer)&pcVar2[2].Error.field_2;
  pcVar2[2].Error._M_string_length = 0;
  pcVar2[2].Error.field_2._M_local_buf[0] = '\0';
  *(undefined1 *)&pcVar2[3]._vptr_cmCommand = 0;
  pcVar2[3].Makefile = (cmMakefile *)0x0;
  pcVar2[3].Error._M_dataplus._M_p = (pointer)0x0;
  pcVar2[3].Error._M_string_length = 0;
  pcVar2->_vptr_cmCommand = (_func_int **)&PTR__cmTryRunCommand_005e8678;
  pcVar2[3].Error.field_2._M_allocated_capacity = (size_type)(pcVar2 + 4);
  *(undefined8 *)((long)&pcVar2[3].Error.field_2 + 8) = 0;
  *(undefined1 *)&pcVar2[4]._vptr_cmCommand = 0;
  pcVar2[4].Error._M_dataplus._M_p = (pointer)&pcVar2[4].Error.field_2;
  pcVar2[4].Error._M_string_length = 0;
  pcVar2[4].Error.field_2._M_local_buf[0] = '\0';
  pcVar2[5]._vptr_cmCommand = (_func_int **)&pcVar2[5].Error;
  pcVar2[5].Makefile = (cmMakefile *)0x0;
  *(undefined1 *)&pcVar2[5].Error._M_dataplus._M_p = 0;
  pcVar2[5].Error.field_2._M_allocated_capacity = (size_type)(pcVar2 + 6);
  *(undefined8 *)((long)&pcVar2[5].Error.field_2 + 8) = 0;
  *(undefined1 *)&pcVar2[6]._vptr_cmCommand = 0;
  pcVar2[6].Error._M_dataplus._M_p = (pointer)&pcVar2[6].Error.field_2;
  pcVar2[6].Error._M_string_length = 0;
  pcVar2[6].Error.field_2._M_local_buf[0] = '\0';
  cmState::AddBuiltinCommand(state,&local_38,pcVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"add_compile_definitions","");
  pcVar2 = (cmCommand *)operator_new(0x30);
  pcVar2->Makefile = (cmMakefile *)0x0;
  (pcVar2->Error)._M_dataplus._M_p = (pointer)&(pcVar2->Error).field_2;
  (pcVar2->Error)._M_string_length = 0;
  (pcVar2->Error).field_2._M_local_buf[0] = '\0';
  pcVar2->_vptr_cmCommand = (_func_int **)&PTR__cmCommand_005e5ae8;
  cmState::AddBuiltinCommand(state,&local_38,pcVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"add_compile_options","");
  pcVar2 = (cmCommand *)operator_new(0x30);
  pcVar2->Makefile = (cmMakefile *)0x0;
  (pcVar2->Error)._M_dataplus._M_p = (pointer)&(pcVar2->Error).field_2;
  (pcVar2->Error)._M_string_length = 0;
  (pcVar2->Error).field_2._M_local_buf[0] = '\0';
  pcVar2->_vptr_cmCommand = (_func_int **)&PTR__cmCommand_005e5b48;
  cmState::AddBuiltinCommand(state,&local_38,pcVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"aux_source_directory","");
  pcVar2 = (cmCommand *)operator_new(0x30);
  pcVar2->Makefile = (cmMakefile *)0x0;
  (pcVar2->Error)._M_dataplus._M_p = (pointer)&(pcVar2->Error).field_2;
  (pcVar2->Error)._M_string_length = 0;
  (pcVar2->Error).field_2._M_local_buf[0] = '\0';
  pcVar2->_vptr_cmCommand = (_func_int **)&PTR__cmCommand_005e5f08;
  cmState::AddBuiltinCommand(state,&local_38,pcVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"export","");
  this = (cmExportCommand *)operator_new(0x390);
  cmExportCommand::cmExportCommand(this);
  cmState::AddBuiltinCommand(state,&local_38,(cmCommand *)this);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"fltk_wrap_ui","");
  pcVar2 = (cmCommand *)operator_new(0x68);
  pcVar2->Makefile = (cmMakefile *)0x0;
  (pcVar2->Error)._M_dataplus._M_p = (pointer)&(pcVar2->Error).field_2;
  (pcVar2->Error)._M_string_length = 0;
  (pcVar2->Error).field_2._M_local_buf[0] = '\0';
  pcVar2->_vptr_cmCommand = (_func_int **)&PTR__cmFLTKWrapUICommand_005e6618;
  pcVar2[1]._vptr_cmCommand = (_func_int **)0x0;
  pcVar2[1].Makefile = (cmMakefile *)0x0;
  pcVar2[1].Error._M_dataplus._M_p = (pointer)0x0;
  pcVar2[1].Error._M_string_length = (size_type)((long)&pcVar2[1].Error.field_2 + 8);
  pcVar2[1].Error.field_2._M_allocated_capacity = 0;
  pcVar2[1].Error.field_2._M_local_buf[8] = '\0';
  cmState::AddBuiltinCommand(state,&local_38,pcVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"include_external_msproject","");
  pcVar2 = (cmCommand *)operator_new(0x30);
  pcVar2->Makefile = (cmMakefile *)0x0;
  (pcVar2->Error)._M_dataplus._M_p = (pointer)&(pcVar2->Error).field_2;
  (pcVar2->Error)._M_string_length = 0;
  (pcVar2->Error).field_2._M_local_buf[0] = '\0';
  pcVar2->_vptr_cmCommand = (_func_int **)&PTR__cmCommand_005e6ef8;
  cmState::AddBuiltinCommand(state,&local_38,pcVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"install_programs","");
  pcVar2 = (cmCommand *)operator_new(0x80);
  pcVar2->Makefile = (cmMakefile *)0x0;
  (pcVar2->Error)._M_dataplus._M_p = (pointer)&(pcVar2->Error).field_2;
  (pcVar2->Error)._M_string_length = 0;
  (pcVar2->Error).field_2._M_local_buf[0] = '\0';
  pcVar2->_vptr_cmCommand = (_func_int **)&PTR__cmInstallProgramsCommand_005e70d8;
  pcVar2[1]._vptr_cmCommand = (_func_int **)0x0;
  pcVar2[1].Makefile = (cmMakefile *)0x0;
  pcVar2[1].Error._M_dataplus._M_p = (pointer)0x0;
  pcVar2[1].Error._M_string_length = (size_type)((long)&pcVar2[1].Error.field_2 + 8);
  pcVar2[1].Error.field_2._M_allocated_capacity = 0;
  pcVar2[1].Error.field_2._M_local_buf[8] = '\0';
  pcVar2[2].Makefile = (cmMakefile *)0x0;
  pcVar2[2].Error._M_dataplus._M_p = (pointer)0x0;
  pcVar2[2].Error._M_string_length = 0;
  cmState::AddBuiltinCommand(state,&local_38,pcVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"add_link_options","");
  pcVar2 = (cmCommand *)operator_new(0x30);
  pcVar2->Makefile = (cmMakefile *)0x0;
  (pcVar2->Error)._M_dataplus._M_p = (pointer)&(pcVar2->Error).field_2;
  (pcVar2->Error)._M_string_length = 0;
  (pcVar2->Error).field_2._M_local_buf[0] = '\0';
  pcVar2->_vptr_cmCommand = (_func_int **)&PTR__cmCommand_005e5ba8;
  cmState::AddBuiltinCommand(state,&local_38,pcVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"link_libraries","");
  pcVar2 = (cmCommand *)operator_new(0x30);
  pcVar2->Makefile = (cmMakefile *)0x0;
  (pcVar2->Error)._M_dataplus._M_p = (pointer)&(pcVar2->Error).field_2;
  (pcVar2->Error)._M_string_length = 0;
  (pcVar2->Error).field_2._M_local_buf[0] = '\0';
  pcVar2->_vptr_cmCommand = (_func_int **)&PTR__cmCommand_005e71f8;
  cmState::AddBuiltinCommand(state,&local_38,pcVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"target_link_options","");
  pcVar2 = (cmCommand *)operator_new(0x58);
  pcVar2->Makefile = (cmMakefile *)0x0;
  (pcVar2->Error)._M_dataplus._M_p = (pointer)&(pcVar2->Error).field_2;
  (pcVar2->Error)._M_string_length = 0;
  (pcVar2->Error).field_2._M_local_buf[0] = '\0';
  pcVar2[1]._vptr_cmCommand = (_func_int **)&pcVar2[1].Error;
  pcVar2[1].Makefile = (cmMakefile *)0x0;
  *(undefined1 *)&pcVar2[1].Error._M_dataplus._M_p = 0;
  pcVar2[1].Error.field_2._M_allocated_capacity = 0;
  pcVar2->_vptr_cmCommand = (_func_int **)&PTR__cmTargetPropCommandBase_005e8358;
  cmState::AddBuiltinCommand(state,&local_38,pcVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"target_link_directories","");
  pcVar2 = (cmCommand *)operator_new(0x58);
  pcVar2->Makefile = (cmMakefile *)0x0;
  (pcVar2->Error)._M_dataplus._M_p = (pointer)&(pcVar2->Error).field_2;
  (pcVar2->Error)._M_string_length = 0;
  (pcVar2->Error).field_2._M_local_buf[0] = '\0';
  pcVar2[1]._vptr_cmCommand = (_func_int **)&pcVar2[1].Error;
  pcVar2[1].Makefile = (cmMakefile *)0x0;
  *(undefined1 *)&pcVar2[1].Error._M_dataplus._M_p = 0;
  pcVar2[1].Error.field_2._M_allocated_capacity = 0;
  pcVar2->_vptr_cmCommand = (_func_int **)&PTR__cmTargetPropCommandBase_005e83d8;
  cmState::AddBuiltinCommand(state,&local_38,pcVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"load_cache","");
  pcVar2 = (cmCommand *)operator_new(0x80);
  pcVar2->Makefile = (cmMakefile *)0x0;
  (pcVar2->Error)._M_dataplus._M_p = (pointer)&(pcVar2->Error).field_2;
  (pcVar2->Error)._M_string_length = 0;
  (pcVar2->Error).field_2._M_local_buf[0] = '\0';
  pcVar2->_vptr_cmCommand = (_func_int **)&PTR__cmLoadCacheCommand_005e75a0;
  *(undefined4 *)&pcVar2[1].Makefile = 0;
  pcVar2[1].Error._M_dataplus._M_p = (pointer)0x0;
  pcVar2[1].Error._M_string_length = (size_type)&pcVar2[1].Makefile;
  pcVar2[1].Error.field_2._M_allocated_capacity = (size_type)&pcVar2[1].Makefile;
  *(undefined8 *)((long)&pcVar2[1].Error.field_2 + 8) = 0;
  pcVar2[2]._vptr_cmCommand = (_func_int **)&pcVar2[2].Error;
  pcVar2[2].Makefile = (cmMakefile *)0x0;
  *(undefined1 *)&pcVar2[2].Error._M_dataplus._M_p = 0;
  cmState::AddBuiltinCommand(state,&local_38,pcVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"qt_wrap_cpp","");
  pcVar2 = (cmCommand *)operator_new(0x30);
  pcVar2->Makefile = (cmMakefile *)0x0;
  (pcVar2->Error)._M_dataplus._M_p = (pointer)&(pcVar2->Error).field_2;
  (pcVar2->Error)._M_string_length = 0;
  (pcVar2->Error).field_2._M_local_buf[0] = '\0';
  pcVar2->_vptr_cmCommand = (_func_int **)&PTR__cmCommand_005e7af8;
  cmState::AddBuiltinCommand(state,&local_38,pcVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"qt_wrap_ui","");
  pcVar2 = (cmCommand *)operator_new(0x30);
  pcVar2->Makefile = (cmMakefile *)0x0;
  (pcVar2->Error)._M_dataplus._M_p = (pointer)&(pcVar2->Error).field_2;
  (pcVar2->Error)._M_string_length = 0;
  (pcVar2->Error).field_2._M_local_buf[0] = '\0';
  pcVar2->_vptr_cmCommand = (_func_int **)&PTR__cmCommand_005e7b58;
  cmState::AddBuiltinCommand(state,&local_38,pcVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"remove_definitions","");
  pcVar2 = (cmCommand *)operator_new(0x30);
  pcVar2->Makefile = (cmMakefile *)0x0;
  (pcVar2->Error)._M_dataplus._M_p = (pointer)&(pcVar2->Error).field_2;
  (pcVar2->Error)._M_string_length = 0;
  (pcVar2->Error).field_2._M_local_buf[0] = '\0';
  pcVar2->_vptr_cmCommand = (_func_int **)&PTR__cmCommand_005e7c18;
  cmState::AddBuiltinCommand(state,&local_38,pcVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"source_group","");
  pcVar2 = (cmCommand *)operator_new(0x30);
  pcVar2->Makefile = (cmMakefile *)0x0;
  (pcVar2->Error)._M_dataplus._M_p = (pointer)&(pcVar2->Error).field_2;
  (pcVar2->Error)._M_string_length = 0;
  (pcVar2->Error).field_2._M_local_buf[0] = '\0';
  pcVar2->_vptr_cmCommand = (_func_int **)&PTR__cmCommand_005e7fd8;
  cmState::AddBuiltinCommand(state,&local_38,pcVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"export_library_dependencies","");
  pcVar2 = (cmCommand *)operator_new(0x58);
  pcVar2->Makefile = (cmMakefile *)0x0;
  (pcVar2->Error)._M_dataplus._M_p = (pointer)&(pcVar2->Error).field_2;
  (pcVar2->Error)._M_string_length = 0;
  (pcVar2->Error).field_2._M_local_buf[0] = '\0';
  pcVar2->_vptr_cmCommand = (_func_int **)&PTR__cmExportLibraryDependenciesCommand_005e65b8;
  pcVar2[1]._vptr_cmCommand = (_func_int **)&pcVar2[1].Error;
  pcVar2[1].Makefile = (cmMakefile *)0x0;
  *(undefined1 *)&pcVar2[1].Error._M_dataplus._M_p = 0;
  pcVar2[1].Error.field_2._M_local_buf[0] = '\0';
  cmState::AddDisallowedCommand
            (state,&local_38,pcVar2,CMP0033,
             "The export_library_dependencies command should not be called; see CMP0033.");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"load_command","");
  pcVar2 = (cmCommand *)operator_new(0x30);
  pcVar2->Makefile = (cmMakefile *)0x0;
  (pcVar2->Error)._M_dataplus._M_p = (pointer)&(pcVar2->Error).field_2;
  (pcVar2->Error)._M_string_length = 0;
  (pcVar2->Error).field_2._M_local_buf[0] = '\0';
  pcVar2->_vptr_cmCommand = (_func_int **)&PTR__cmCommand_005e7648;
  cmState::AddDisallowedCommand
            (state,&local_38,pcVar2,CMP0031,
             "The load_command command should not be called; see CMP0031.");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"output_required_files","");
  pcVar2 = (cmCommand *)operator_new(0x70);
  pcVar2->Makefile = (cmMakefile *)0x0;
  (pcVar2->Error)._M_dataplus._M_p = (pointer)&(pcVar2->Error).field_2;
  (pcVar2->Error)._M_string_length = 0;
  (pcVar2->Error).field_2._M_local_buf[0] = '\0';
  pcVar2->_vptr_cmCommand = (_func_int **)&PTR__cmOutputRequiredFilesCommand_005e79a8;
  pcVar2[1]._vptr_cmCommand = (_func_int **)&pcVar2[1].Error;
  pcVar2[1].Makefile = (cmMakefile *)0x0;
  *(undefined1 *)&pcVar2[1].Error._M_dataplus._M_p = 0;
  pcVar2[1].Error.field_2._M_allocated_capacity = (size_type)(pcVar2 + 2);
  *(undefined8 *)((long)&pcVar2[1].Error.field_2 + 8) = 0;
  *(undefined1 *)&pcVar2[2]._vptr_cmCommand = 0;
  cmState::AddDisallowedCommand
            (state,&local_38,pcVar2,CMP0032,
             "The output_required_files command should not be called; see CMP0032.");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"subdir_depends","");
  pcVar2 = (cmCommand *)operator_new(0x30);
  pcVar2->Makefile = (cmMakefile *)0x0;
  (pcVar2->Error)._M_dataplus._M_p = (pointer)&(pcVar2->Error).field_2;
  (pcVar2->Error)._M_string_length = 0;
  (pcVar2->Error).field_2._M_local_buf[0] = '\0';
  pcVar2->_vptr_cmCommand = (_func_int **)&PTR__cmCommand_005e80f8;
  cmState::AddDisallowedCommand
            (state,&local_38,pcVar2,CMP0029,
             "The subdir_depends command should not be called; see CMP0029.");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"utility_source","");
  pcVar2 = (cmCommand *)operator_new(0x30);
  pcVar2->Makefile = (cmMakefile *)0x0;
  (pcVar2->Error)._M_dataplus._M_p = (pointer)&(pcVar2->Error).field_2;
  (pcVar2->Error)._M_string_length = 0;
  (pcVar2->Error).field_2._M_local_buf[0] = '\0';
  pcVar2->_vptr_cmCommand = (_func_int **)&PTR__cmCommand_005e87f8;
  cmState::AddDisallowedCommand
            (state,&local_38,pcVar2,CMP0034,
             "The utility_source command should not be called; see CMP0034.");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"variable_requires","");
  pcVar2 = (cmCommand *)operator_new(0x30);
  pcVar2->Makefile = (cmMakefile *)0x0;
  (pcVar2->Error)._M_dataplus._M_p = (pointer)&(pcVar2->Error).field_2;
  (pcVar2->Error)._M_string_length = 0;
  (pcVar2->Error).field_2._M_local_buf[0] = '\0';
  pcVar2->_vptr_cmCommand = (_func_int **)&PTR__cmCommand_005e8858;
  cmState::AddDisallowedCommand
            (state,&local_38,pcVar2,CMP0035,
             "The variable_requires command should not be called; see CMP0035.");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void GetProjectCommands(cmState* state)
{
  state->AddBuiltinCommand("add_custom_command",
                           new cmAddCustomCommandCommand);
  state->AddBuiltinCommand("add_custom_target", new cmAddCustomTargetCommand);
  state->AddBuiltinCommand("add_definitions", new cmAddDefinitionsCommand);
  state->AddBuiltinCommand("add_dependencies", new cmAddDependenciesCommand);
  state->AddBuiltinCommand("add_executable", new cmAddExecutableCommand);
  state->AddBuiltinCommand("add_library", new cmAddLibraryCommand);
  state->AddBuiltinCommand("add_subdirectory", new cmAddSubDirectoryCommand);
  state->AddBuiltinCommand("add_test", new cmAddTestCommand);
  state->AddBuiltinCommand("build_command", new cmBuildCommand);
  state->AddBuiltinCommand("create_test_sourcelist",
                           new cmCreateTestSourceList);
  state->AddBuiltinCommand("define_property", new cmDefinePropertyCommand);
  state->AddBuiltinCommand("enable_language", new cmEnableLanguageCommand);
  state->AddBuiltinCommand("enable_testing", new cmEnableTestingCommand);
  state->AddBuiltinCommand("get_source_file_property",
                           new cmGetSourceFilePropertyCommand);
  state->AddBuiltinCommand("get_target_property",
                           new cmGetTargetPropertyCommand);
  state->AddBuiltinCommand("get_test_property", new cmGetTestPropertyCommand);
  state->AddBuiltinCommand("include_directories",
                           new cmIncludeDirectoryCommand);
  state->AddBuiltinCommand("include_regular_expression",
                           new cmIncludeRegularExpressionCommand);
  state->AddBuiltinCommand("install", new cmInstallCommand);
  state->AddBuiltinCommand("install_files", new cmInstallFilesCommand);
  state->AddBuiltinCommand("install_targets", new cmInstallTargetsCommand);
  state->AddBuiltinCommand("link_directories", new cmLinkDirectoriesCommand);
  state->AddBuiltinCommand("project", new cmProjectCommand);
  state->AddBuiltinCommand("set_source_files_properties",
                           new cmSetSourceFilesPropertiesCommand);
  state->AddBuiltinCommand("set_target_properties",
                           new cmSetTargetPropertiesCommand);
  state->AddBuiltinCommand("set_tests_properties",
                           new cmSetTestsPropertiesCommand);
  state->AddBuiltinCommand("subdirs", new cmSubdirCommand);
  state->AddBuiltinCommand("target_compile_definitions",
                           new cmTargetCompileDefinitionsCommand);
  state->AddBuiltinCommand("target_compile_features",
                           new cmTargetCompileFeaturesCommand);
  state->AddBuiltinCommand("target_compile_options",
                           new cmTargetCompileOptionsCommand);
  state->AddBuiltinCommand("target_include_directories",
                           new cmTargetIncludeDirectoriesCommand);
  state->AddBuiltinCommand("target_link_libraries",
                           new cmTargetLinkLibrariesCommand);
  state->AddBuiltinCommand("target_sources", new cmTargetSourcesCommand);
  state->AddBuiltinCommand("try_compile", new cmTryCompileCommand);
  state->AddBuiltinCommand("try_run", new cmTryRunCommand);

#if defined(CMAKE_BUILD_WITH_CMAKE)
  state->AddBuiltinCommand("add_compile_definitions",
                           new cmAddCompileDefinitionsCommand);
  state->AddBuiltinCommand("add_compile_options",
                           new cmAddCompileOptionsCommand);
  state->AddBuiltinCommand("aux_source_directory",
                           new cmAuxSourceDirectoryCommand);
  state->AddBuiltinCommand("export", new cmExportCommand);
  state->AddBuiltinCommand("fltk_wrap_ui", new cmFLTKWrapUICommand);
  state->AddBuiltinCommand("include_external_msproject",
                           new cmIncludeExternalMSProjectCommand);
  state->AddBuiltinCommand("install_programs", new cmInstallProgramsCommand);
  state->AddBuiltinCommand("add_link_options", new cmAddLinkOptionsCommand);
  state->AddBuiltinCommand("link_libraries", new cmLinkLibrariesCommand);
  state->AddBuiltinCommand("target_link_options",
                           new cmTargetLinkOptionsCommand);
  state->AddBuiltinCommand("target_link_directories",
                           new cmTargetLinkDirectoriesCommand);
  state->AddBuiltinCommand("load_cache", new cmLoadCacheCommand);
  state->AddBuiltinCommand("qt_wrap_cpp", new cmQTWrapCPPCommand);
  state->AddBuiltinCommand("qt_wrap_ui", new cmQTWrapUICommand);
  state->AddBuiltinCommand("remove_definitions",
                           new cmRemoveDefinitionsCommand);
  state->AddBuiltinCommand("source_group", new cmSourceGroupCommand);

  state->AddDisallowedCommand(
    "export_library_dependencies", new cmExportLibraryDependenciesCommand,
    cmPolicies::CMP0033,
    "The export_library_dependencies command should not be called; "
    "see CMP0033.");
  state->AddDisallowedCommand(
    "load_command", new cmLoadCommandCommand, cmPolicies::CMP0031,
    "The load_command command should not be called; see CMP0031.");
  state->AddDisallowedCommand(
    "output_required_files", new cmOutputRequiredFilesCommand,
    cmPolicies::CMP0032,
    "The output_required_files command should not be called; see CMP0032.");
  state->AddDisallowedCommand(
    "subdir_depends", new cmSubdirDependsCommand, cmPolicies::CMP0029,
    "The subdir_depends command should not be called; see CMP0029.");
  state->AddDisallowedCommand(
    "utility_source", new cmUtilitySourceCommand, cmPolicies::CMP0034,
    "The utility_source command should not be called; see CMP0034.");
  state->AddDisallowedCommand(
    "variable_requires", new cmVariableRequiresCommand, cmPolicies::CMP0035,
    "The variable_requires command should not be called; see CMP0035.");
#endif
}